

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O3

void kmpc_free(void *ptr)

{
  kmp_info_t *th;
  int iVar1;
  
  if ((ptr != (void *)0x0) && (__kmp_init_serial != 0)) {
    iVar1 = __kmp_get_global_thread_id();
    th = __kmp_threads[iVar1];
    __kmp_bget_dequeue(th);
    if (*(void **)((long)ptr + -8) == (void *)0x0) {
      __kmp_debug_assert("assertion failure",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_alloc.cpp"
                         ,0x49c);
    }
    brel(th,*(void **)((long)ptr + -8));
    return;
  }
  return;
}

Assistant:

void kmpc_free(void *ptr) {
  if (!__kmp_init_serial) {
    return;
  }
  if (ptr != NULL) {
    kmp_info_t *th = __kmp_get_thread();
    __kmp_bget_dequeue(th); /* Release any queued buffers */
    // extract allocated pointer and free it
    KMP_ASSERT(*((void **)ptr - 1));
    brel(th, *((void **)ptr - 1));
  }
}